

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_stat(uv_loop_t *loop,uv_fs_t *req,char *path,uv_fs_cb cb)

{
  char *pcVar1;
  _func_void_uv__work_ptr_int *in_RCX;
  uv__work *in_RDX;
  uv__work *in_RSI;
  uv_loop_t *in_RDI;
  int local_4;
  
  uv__req_init(in_RDI,(uv_req_t *)in_RSI,UV_FS);
  *(undefined4 *)(in_RSI->wq + 1) = 6;
  in_RSI[1].loop = (uv_loop_s *)0x0;
  in_RSI[1].wq[0] = (void *)0x0;
  in_RSI[1].work = (_func_void_uv__work_ptr *)in_RDI;
  in_RSI[1].wq[1] = (void *)0x0;
  in_RSI[6].work = (_func_void_uv__work_ptr *)0x0;
  in_RSI[1].done = in_RCX;
  pcVar1 = strdup((char *)in_RDX);
  in_RSI[1].wq[1] = pcVar1;
  if (in_RSI[1].wq[1] == (void *)0x0) {
    local_4 = -0xc;
  }
  else if (in_RCX == (_func_void_uv__work_ptr_int *)0x0) {
    uv__fs_work((uv__work *)cb);
    uv__fs_done(in_RDX,(int)((ulong)in_RCX >> 0x20));
    local_4 = (int)in_RSI[1].loop;
  }
  else {
    uv__work_submit(in_RDI,in_RSI,(_func_void_uv__work_ptr *)in_RDX,in_RCX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv_fs_stat(uv_loop_t* loop, uv_fs_t* req, const char* path, uv_fs_cb cb) {
  INIT(STAT);
  PATH;
  POST;
}